

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

bool __thiscall
deqp::gls::UniformBlockCase::checkIndexQueries
          (UniformBlockCase *this,deUint32 program,UniformLayout *layout)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  deUint32 err;
  undefined4 extraout_var;
  pointer pBVar5;
  long lVar6;
  ulong uVar7;
  undefined1 local_1b0 [384];
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  pBVar5 = (layout->blocks).
           super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(layout->blocks).
                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5) >> 6) < 1) {
    bVar2 = true;
  }
  else {
    this_00 = (ostringstream *)(local_1b0 + 8);
    bVar2 = true;
    lVar6 = 0;
    uVar7 = 0;
    do {
      uVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0xb38))
                        (program,*(undefined8 *)((long)&(pBVar5->name)._M_dataplus._M_p + lVar6));
      if (uVar7 != uVar4) {
        local_1b0._0_8_ = pTVar1;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"ERROR: glGetUniformBlockIndex(",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,*(char **)((long)&(pBVar5->name)._M_dataplus._M_p + lVar6),
                   *(long *)((long)&(pBVar5->name)._M_string_length + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") returned ",0xb);
        std::ostream::operator<<(this_00,uVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected ",0xb);
        std::ostream::operator<<(this_00,(int)uVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"!",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        bVar2 = false;
      }
      err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
      glu::checkError(err,"glGetUniformBlockIndex()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                      ,0x75d);
      uVar7 = uVar7 + 1;
      pBVar5 = (layout->blocks).
               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x40;
    } while ((long)uVar7 <
             (long)(int)((ulong)((long)(layout->blocks).
                                       super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5) >>
                        6));
  }
  return bVar2;
}

Assistant:

bool UniformBlockCase::checkIndexQueries (deUint32 program, const UniformLayout& layout) const
{
	tcu::TestLog&				log			= m_testCtx.getLog();
	const glw::Functions&		gl			= m_renderCtx.getFunctions();
	bool						allOk		= true;

	// \note Spec mandates that uniform blocks are assigned consecutive locations from 0
	//		 to ACTIVE_UNIFORM_BLOCKS. BlockLayoutEntries are stored in that order in UniformLayout.
	for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
	{
		const BlockLayoutEntry&		block		= layout.blocks[blockNdx];
		const int					queriedNdx	= gl.getUniformBlockIndex(program, block.name.c_str());

		if (queriedNdx != blockNdx)
		{
			log << TestLog::Message << "ERROR: glGetUniformBlockIndex(" << block.name << ") returned " << queriedNdx << ", expected " << blockNdx << "!" << TestLog::EndMessage;
			allOk = false;
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformBlockIndex()");
	}

	return allOk;
}